

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curve25519.cc
# Opt level: O2

void x25519_ge_scalarmult_base(ge_p3 *h,uint8_t *a)

{
  byte bVar1;
  int iVar2;
  long lVar3;
  char cVar4;
  char cVar5;
  ulong uVar6;
  char e [64];
  ge_p1p1 r;
  ge_precomp t;
  ge_p2 s;
  
  iVar2 = CRYPTO_is_BMI1_capable();
  if (((iVar2 != 0) && (iVar2 = CRYPTO_is_BMI2_capable(), iVar2 != 0)) &&
     (iVar2 = CRYPTO_is_ADX_capable(), iVar2 != 0)) {
    x25519_ge_scalarmult_base_adx((uint8_t (*) [32])&r,a);
    fiat_25519_from_bytes((uint64_t *)h,(uint8_t *)&r);
    fiat_25519_from_bytes((h->Y).v,(uint8_t *)(r.X.v + 4));
    fiat_25519_from_bytes((h->Z).v,(uint8_t *)(r.Y.v + 3));
    fiat_25519_from_bytes((h->T).v,(uint8_t *)(r.Z.v + 2));
    return;
  }
  for (lVar3 = 0; lVar3 != 0x20; lVar3 = lVar3 + 1) {
    bVar1 = a[lVar3];
    e[lVar3 * 2] = bVar1 & 0xf;
    e[lVar3 * 2 + 1] = bVar1 >> 4;
  }
  cVar5 = '\0';
  for (lVar3 = 0; lVar3 != 0x3f; lVar3 = lVar3 + 1) {
    cVar4 = cVar5 + e[lVar3];
    bVar1 = cVar4 + 8;
    cVar5 = (char)bVar1 >> 4;
    e[lVar3] = cVar4 - (bVar1 & 0xf0);
  }
  e[0x3f] = e[0x3f] + cVar5;
  (h->X).v[2] = 0;
  (h->X).v[3] = 0;
  (h->X).v[4] = 0;
  (h->X).v[0] = 0;
  (h->X).v[1] = 0;
  (h->Y).v[1] = 0;
  (h->Y).v[2] = 0;
  (h->Y).v[3] = 0;
  (h->Y).v[4] = 0;
  (h->Y).v[0] = 1;
  (h->Z).v[1] = 0;
  (h->Z).v[2] = 0;
  (h->Z).v[3] = 0;
  (h->Z).v[4] = 0;
  (h->Z).v[0] = 1;
  (h->T).v[0] = 0;
  (h->T).v[1] = 0;
  (h->T).v[4] = 0;
  (h->T).v[2] = 0;
  (h->T).v[3] = 0;
  iVar2 = 0;
  for (uVar6 = 1; uVar6 < 0x40; uVar6 = uVar6 + 2) {
    table_select(&t,iVar2,e[uVar6]);
    ge_madd(&r,h,&t);
    x25519_ge_p1p1_to_p3(h,&r);
    iVar2 = iVar2 + 1;
  }
  ge_p3_dbl(&r,h);
  x25519_ge_p1p1_to_p2(&s,&r);
  ge_p2_dbl(&r,&s);
  x25519_ge_p1p1_to_p2(&s,&r);
  ge_p2_dbl(&r,&s);
  x25519_ge_p1p1_to_p2(&s,&r);
  ge_p2_dbl(&r,&s);
  x25519_ge_p1p1_to_p3(h,&r);
  iVar2 = 0;
  for (uVar6 = 0; uVar6 < 0x40; uVar6 = uVar6 + 2) {
    table_select(&t,iVar2,e[uVar6]);
    ge_madd(&r,h,&t);
    x25519_ge_p1p1_to_p3(h,&r);
    iVar2 = iVar2 + 1;
  }
  return;
}

Assistant:

void x25519_ge_scalarmult_base(ge_p3 *h, const uint8_t a[32]) {
#if defined(BORINGSSL_FE25519_ADX)
  if (CRYPTO_is_BMI1_capable() && CRYPTO_is_BMI2_capable() &&
      CRYPTO_is_ADX_capable()) {
    uint8_t t[4][32];
    x25519_ge_scalarmult_base_adx(t, a);
    fiat_25519_from_bytes(h->X.v, t[0]);
    fiat_25519_from_bytes(h->Y.v, t[1]);
    fiat_25519_from_bytes(h->Z.v, t[2]);
    fiat_25519_from_bytes(h->T.v, t[3]);
    return;
  }
#endif
  signed char e[64];
  signed char carry;
  ge_p1p1 r;
  ge_p2 s;
  ge_precomp t;
  int i;

  for (i = 0; i < 32; ++i) {
    e[2 * i + 0] = (a[i] >> 0) & 15;
    e[2 * i + 1] = (a[i] >> 4) & 15;
  }
  // each e[i] is between 0 and 15
  // e[63] is between 0 and 7

  carry = 0;
  for (i = 0; i < 63; ++i) {
    e[i] += carry;
    carry = e[i] + 8;
    carry >>= 4;
    e[i] -= carry << 4;
  }
  e[63] += carry;
  // each e[i] is between -8 and 8

  ge_p3_0(h);
  for (i = 1; i < 64; i += 2) {
    table_select(&t, i / 2, e[i]);
    ge_madd(&r, h, &t);
    x25519_ge_p1p1_to_p3(h, &r);
  }

  ge_p3_dbl(&r, h);
  x25519_ge_p1p1_to_p2(&s, &r);
  ge_p2_dbl(&r, &s);
  x25519_ge_p1p1_to_p2(&s, &r);
  ge_p2_dbl(&r, &s);
  x25519_ge_p1p1_to_p2(&s, &r);
  ge_p2_dbl(&r, &s);
  x25519_ge_p1p1_to_p3(h, &r);

  for (i = 0; i < 64; i += 2) {
    table_select(&t, i / 2, e[i]);
    ge_madd(&r, h, &t);
    x25519_ge_p1p1_to_p3(h, &r);
  }
}